

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O2

void __thiscall
QEglFSKmsScreen::QEglFSKmsScreen
          (QEglFSKmsScreen *this,QEglFSKmsDevice *device,QKmsOutput *output,bool headless)

{
  drmModePropertyBlobPtr p_Var1;
  char cVar2;
  QEglFSKmsInterruptHandler *this_00;
  QLoggingCategory *pQVar3;
  QDebug *pQVar4;
  char *pcVar5;
  char16_t *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_108;
  QArrayDataPointer<char> local_f0;
  QArrayDataPointer<char> local_d8;
  QArrayDataPointer<char> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  char local_78 [24];
  char *local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QEglFSScreen::QEglFSScreen
            (&this->super_QEglFSScreen,
             *(void **)(QGuiApplicationPrivate::platform_integration + 0x30));
  *(undefined ***)this = &PTR__QEglFSKmsScreen_001222a0;
  this->m_device = device;
  QKmsOutput::QKmsOutput(&this->m_output,output);
  (this->m_edid).serialNumber.d.ptr = (char16_t *)0x0;
  (this->m_edid).serialNumber.d.size = 0;
  (this->m_edid).model.d.size = 0;
  (this->m_edid).serialNumber.d.d = (Data *)0x0;
  (this->m_edid).model.d.d = (Data *)0x0;
  (this->m_edid).model.d.ptr = (char16_t *)0x0;
  (this->m_edid).manufacturer.d.ptr = (char16_t *)0x0;
  (this->m_edid).manufacturer.d.size = 0;
  (this->m_edid).identifier.d.size = 0;
  (this->m_edid).manufacturer.d.d = (Data *)0x0;
  (this->m_edid).identifier.d.d = (Data *)0x0;
  (this->m_edid).identifier.d.ptr = (char16_t *)0x0;
  (this->m_edid).physicalSize.wd = -1.0;
  (this->m_edid).physicalSize.ht = -1.0;
  (this->m_edid).redChromaticity.xp = 0.0;
  (this->m_edid).redChromaticity.yp = 0.0;
  (this->m_edid).greenChromaticity.xp = 0.0;
  (this->m_edid).greenChromaticity.yp = 0.0;
  (this->m_edid).blueChromaticity.xp = 0.0;
  (this->m_edid).blueChromaticity.yp = 0.0;
  (this->m_edid).whiteChromaticity.xp = 0.0;
  (this->m_edid).whiteChromaticity.yp = 0.0;
  (this->m_edid).tables.d.size = 0;
  (this->m_edid).tables.d.d = (Data *)0x0;
  (this->m_edid).tables.d.ptr = (QList<unsigned_short> *)0x0;
  (this->m_pos).xp = 0;
  (this->m_pos).yp = 0;
  this->m_cursorOutOfRange = false;
  (this->m_siblings).d.d = (Data *)0x0;
  (this->m_siblings).d.ptr = (QPlatformScreen **)0x0;
  *(undefined8 *)((long)&(this->m_siblings).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->m_siblings).d.size + 4) = 0;
  this_00 = (QEglFSKmsInterruptHandler *)operator_new(0x20);
  QEglFSKmsInterruptHandler::QEglFSKmsInterruptHandler(this_00,this);
  this->m_interruptHandler = this_00;
  this->m_headless = headless;
  QList<QPlatformScreen_*>::append(&this->m_siblings,(parameter_type)this);
  p_Var1 = (this->m_output).edid_blob;
  if (p_Var1 == (drmModePropertyBlobPtr)0x0) {
    pQVar3 = QtPrivateLogging::qLcEglfsKmsDebug();
    if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_60 = pQVar3->name;
      local_78[0] = '\x02';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = '\0';
      local_78[9] = '\0';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<((QDebug *)&local_90,"No EDID data for output");
      (**(code **)(*(long *)this + 0x90))(&local_58,this);
      QDebug::operator<<(pQVar4,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QDebug::~QDebug((QDebug *)&local_90);
    }
  }
  else {
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_58,(char *)p_Var1->data,(ulong)p_Var1->length);
    cVar2 = QEdidParser::parse((QByteArray *)&this->m_edid);
    pQVar3 = QtPrivateLogging::qLcEglfsKmsDebug();
    if (cVar2 == '\0') {
      if (((uint)pQVar3->field_2 & 1) != 0) {
        local_60 = pQVar3->name;
        local_78[0] = '\x02';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\0';
        local_78[9] = '\0';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<((QDebug *)&local_a8,"Failed to parse EDID data for output");
        (**(code **)(*(long *)this + 0x90))(&local_90,this);
        QDebug::operator<<(pQVar4,(QString *)&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QDebug::~QDebug((QDebug *)&local_a8);
      }
    }
    else if (((uint)pQVar3->field_2 & 1) != 0) {
      local_60 = pQVar3->name;
      local_78[0] = '\x02';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = '\0';
      local_78[9] = '\0';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      (**(code **)(*(long *)this + 0x90))(&local_a8,this);
      QString::toLatin1_helper_inplace((QString *)&local_90);
      pcVar6 = local_90.ptr;
      if (local_90.ptr == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_c0);
      pcVar7 = local_c0.ptr;
      if (local_c0.ptr == (char *)0x0) {
        pcVar7 = (char *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_d8);
      pcVar5 = local_d8.ptr;
      if (local_d8.ptr == (char *)0x0) {
        pcVar5 = (char *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_f0);
      if (local_f0.ptr == (char *)0x0) {
        local_f0.ptr = (char *)&QByteArray::_empty;
      }
      QString::toLatin1_helper((QString *)&local_108);
      if (local_108.ptr == (char *)0x0) {
        local_108.ptr = (char *)&QByteArray::_empty;
      }
      QMessageLogger::debug
                (local_78,SUB84((this->m_edid).physicalSize.wd,0),
                 SUB84((this->m_edid).physicalSize.ht,0),
                 "EDID data for output \"%s\": identifier \'%s\', manufacturer \'%s\', model \'%s\', serial \'%s\', physical size: %.2fx%.2f"
                 ,pcVar6,pcVar7,pcVar5,local_f0.ptr,local_108.ptr);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_f0);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_c0);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEglFSKmsScreen::QEglFSKmsScreen(QEglFSKmsDevice *device, const QKmsOutput &output, bool headless)
    : QEglFSScreen(static_cast<QEglFSIntegration *>(QGuiApplicationPrivate::platformIntegration())->display())
    , m_device(device)
    , m_output(output)
    , m_cursorOutOfRange(false)
    , m_powerState(PowerStateOn)
    , m_interruptHandler(new QEglFSKmsInterruptHandler(this))
    , m_headless(headless)
{
    m_siblings << this; // gets overridden later

    if (m_output.edid_blob) {
        QByteArray edid(reinterpret_cast<const char *>(m_output.edid_blob->data), m_output.edid_blob->length);
        if (m_edid.parse(edid))
            qCDebug(qLcEglfsKmsDebug, "EDID data for output \"%s\": identifier '%s', manufacturer '%s', model '%s', serial '%s', physical size: %.2fx%.2f",
                    name().toLatin1().constData(),
                    m_edid.identifier.toLatin1().constData(),
                    m_edid.manufacturer.toLatin1().constData(),
                    m_edid.model.toLatin1().constData(),
                    m_edid.serialNumber.toLatin1().constData(),
                    m_edid.physicalSize.width(), m_edid.physicalSize.height());
        else
            qCDebug(qLcEglfsKmsDebug) << "Failed to parse EDID data for output" << name(); // keep this debug, not warning
    } else {
        qCDebug(qLcEglfsKmsDebug) << "No EDID data for output" << name();
    }
}